

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_SortMerge(int *p1Beg,int *p1End,int *p2Beg,int *p2End,int *pOut)

{
  int *piVar1;
  int *pOutBeg;
  int *piStack_30;
  int nEntries;
  int *pOut_local;
  int *p2End_local;
  int *p2Beg_local;
  int *p1End_local;
  int *p1Beg_local;
  
  piStack_30 = pOut;
  p2End_local = p2Beg;
  p1End_local = p1Beg;
  while (p1End_local < p1End && p2End_local < p2End) {
    if (*p1End_local == *p2End_local) {
      piVar1 = piStack_30 + 1;
      *piStack_30 = *p1End_local;
      piStack_30 = piStack_30 + 2;
      *piVar1 = *p2End_local;
      p2End_local = p2End_local + 1;
      p1End_local = p1End_local + 1;
    }
    else {
      if (*p1End_local < *p2End_local) {
        *piStack_30 = *p1End_local;
        p1End_local = p1End_local + 1;
      }
      else {
        *piStack_30 = *p2End_local;
        p2End_local = p2End_local + 1;
      }
      piStack_30 = piStack_30 + 1;
    }
  }
  while (p1End_local < p1End) {
    *piStack_30 = *p1End_local;
    piStack_30 = piStack_30 + 1;
    p1End_local = p1End_local + 1;
  }
  while (p2End_local < p2End) {
    *piStack_30 = *p2End_local;
    piStack_30 = piStack_30 + 1;
    p2End_local = p2End_local + 1;
  }
  if ((long)piStack_30 - (long)pOut >> 2 ==
      (long)((int)((long)p1End - (long)p1Beg >> 2) + (int)((long)p2End - (long)p2Beg >> 2))) {
    return;
  }
  __assert_fail("pOut - pOutBeg == nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilSort.c"
                ,0x42,"void Abc_SortMerge(int *, int *, int *, int *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merging two lists of entries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SortMerge( int * p1Beg, int * p1End, int * p2Beg, int * p2End, int * pOut )
{
    int nEntries = (p1End - p1Beg) + (p2End - p2Beg);
    int * pOutBeg = pOut;
    while ( p1Beg < p1End && p2Beg < p2End )
    {
        if ( *p1Beg == *p2Beg )
            *pOut++ = *p1Beg++, *pOut++ = *p2Beg++; 
        else if ( *p1Beg < *p2Beg )
            *pOut++ = *p1Beg++; 
        else // if ( *p1Beg > *p2Beg )
            *pOut++ = *p2Beg++; 
    }
    while ( p1Beg < p1End )
        *pOut++ = *p1Beg++; 
    while ( p2Beg < p2End )
        *pOut++ = *p2Beg++;
    assert( pOut - pOutBeg == nEntries );
}